

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 17_letterCombinationPhonenum.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* letterCombinations(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *digits)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  reference pvVar7;
  reference pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  char local_289;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_288;
  char i;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  string temp;
  string s;
  value_type local_228;
  undefined1 local_201;
  undefined1 local_200 [8];
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  q;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a7;
  undefined1 local_1a6;
  allocator<char> local_1a5;
  allocator<char> local_1a4;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  allocator<char> local_1a0;
  allocator<char> local_19f;
  allocator<char> local_19e;
  allocator<char> local_19d [20];
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  phone;
  string *digits_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ans;
  
  local_1a6 = 1;
  local_188 = &local_180;
  phone.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = digits;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"0",&local_189);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"1",local_19d);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"abc",&local_19e);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"def",&local_19f);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"ghi",&local_1a0);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"jkl",&local_1a1);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"mno",&local_1a2);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"pqrs",&local_1a3);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"tuv",&local_1a4);
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"wxyz",&local_1a5);
  local_1a6 = 0;
  local_40 = &local_180;
  local_38 = 10;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1a7);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30,__l,&local_1a7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1a7);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
  do {
    local_378 = local_378 + -1;
    std::__cxx11::string::~string((string *)local_378);
  } while (local_378 != &local_180);
  std::allocator<char>::~allocator(&local_1a5);
  std::allocator<char>::~allocator(&local_1a4);
  std::allocator<char>::~allocator(&local_1a3);
  std::allocator<char>::~allocator(&local_1a2);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::~allocator(&local_1a0);
  std::allocator<char>::~allocator(&local_19f);
  std::allocator<char>::~allocator(&local_19e);
  std::allocator<char>::~allocator(local_19d);
  std::allocator<char>::~allocator(&local_189);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::
    queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
              ((queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)local_200);
    local_201 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"",(allocator<char> *)(s.field_2._M_local_buf + 0xf));
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_200,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
    while (bVar1 = std::
                   queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::empty((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_200), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::
               queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::front((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_200);
      std::__cxx11::string::string((string *)(temp.field_2._M_local_buf + 8),(string *)pvVar3);
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_200);
      lVar4 = std::__cxx11::string::length();
      lVar5 = std::__cxx11::string::length();
      if (lVar4 == lVar5) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)((long)&temp.field_2 + 8));
      }
      else {
        std::__cxx11::string::length();
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)digits);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_30,(long)(*pcVar6 + -0x30));
        std::__cxx11::string::string((string *)&__range3,(string *)pvVar7);
        __end3._M_current = (char *)std::__cxx11::string::begin();
        _Stack_288._M_current = (char *)std::__cxx11::string::end();
        while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffd78), bVar1) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end3);
          local_289 = *pcVar8;
          std::operator+(&local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&temp.field_2 + 8),local_289);
          std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_200,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end3);
        }
        std::__cxx11::string::~string((string *)&__range3);
      }
      std::__cxx11::string::~string((string *)(temp.field_2._M_local_buf + 8));
    }
    q.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ = 1;
    local_201 = 1;
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~queue((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_200);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    q.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

vector<string> letterCombinations(string digits) {
    vector<string> phone = {"0", "1", "abc", "def", "ghi", "jkl", "mno", "pqrs", "tuv", "wxyz"};
    if(digits.empty())
        return {};
    
    queue<string> q;
    vector<string> ans;
    
    q.push("");

    while(!q.empty()){
        string s = q.front();
        q.pop();
        
        if(s.length() == digits.length())
            ans.push_back(s);
        else{
            string temp = phone[digits[s.length()] - '0'];
            for(auto i : temp)
                q.push(s + i);
        }
    }
    return ans;
}